

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_action.c
# Opt level: O1

int s98c_register_device(s98c *ctx,char *dev_name,uint32_t clock,uint8_t panpot)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  s98deviceinfo *psVar4;
  size_t sVar5;
  
  if ((ctx->header).version == -1) {
    s98c_register_device_cold_1();
    iVar3 = 1;
  }
  else {
    uVar2 = s98c_find_device(dev_name);
    if (uVar2 == 0xffffffff) {
      fprintf(_stderr,"error: Undefined device name: %s\n",dev_name);
      iVar3 = 2;
    }
    else {
      if (ctx->dev_count <= (ulong)(ctx->header).device_count) {
        sVar5 = ctx->dev_count + 4;
        ctx->dev_count = sVar5;
        psVar4 = (s98deviceinfo *)realloc(ctx->devices,sVar5 * 0x10);
        ctx->devices = psVar4;
      }
      psVar4 = ctx->devices;
      uVar1 = (ctx->header).device_count;
      (ctx->header).device_count = uVar1 + 1;
      psVar4[uVar1].device = uVar2;
      psVar4[uVar1].clock = clock;
      psVar4[uVar1].panpot = (uint)panpot;
      psVar4[uVar1].reserved = 0;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int s98c_register_device(struct s98c* ctx, char* dev_name, uint32_t clock, uint8_t panpot)
{
    if(ctx->header.version == -1) {
        fprintf(stderr, "error: Cannot define #device without #version\n");
        return 1;
    }
    {
        struct s98deviceinfo info;

        info.device = s98c_find_device(dev_name);
        if(info.device == -1) {
            fprintf(stderr, "error: Undefined device name: %s\n", dev_name);
            return 2;
        }
        info.clock = clock;
        info.panpot = panpot;
        info.reserved = 0;

        if(ctx->header.device_count >= ctx->dev_count) {
            ctx->dev_count += INITIAL_DEVICES;
            ctx->devices = realloc(ctx->devices, ctx->dev_count * sizeof(struct s98deviceinfo));
        }

        ctx->devices[ctx->header.device_count++] = info;
    }
    return 0;
}